

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Range.hpp
# Opt level: O2

unsigned_long __thiscall binlog::Range::read<unsigned_long>(Range *this)

{
  unsigned_long uVar1;
  
  throw_if_overflow(this,8);
  uVar1 = *(unsigned_long *)this->_begin;
  this->_begin = (char *)((long)this->_begin + 8);
  return uVar1;
}

Assistant:

T read()
  {
    static_assert(std::is_trivially_copyable<T>::value, "T must be trivially copyable");

    throw_if_overflow(sizeof(T));

    T dst;
    memcpy(&dst, _begin, sizeof(T));
    _begin += sizeof(T);

    return dst;
  }